

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

void __thiscall
glcts::InterfaceMatchingCaseUInt::generateVarLinkFragmentShaderSrc
          (InterfaceMatchingCaseUInt *this,string *outFragSrc,GLSLVersion glslVersion,
          string *precision,TestType testMode)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  ostream *poVar4;
  long lVar5;
  ostringstream fragSrc;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)local_1c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar2);
  }
  poVar3 = (ostream *)local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  lVar5 = 0x12;
  pcVar1 = "flat in uint var;\n";
  if (testMode != DEFAULT_PRECISION) {
    if (testMode == SET_DEFAULT_PRECISION) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"precision ",10);
      poVar3 = (ostream *)local_1a8;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(precision->_M_dataplus)._M_p,precision->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," int;\n",6);
    }
    else {
      if (testMode != SET_PRECISION) goto LAB_00be8194;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"flat in ",8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(precision->_M_dataplus)._M_p,
                          precision->_M_string_length);
      lVar5 = 0xb;
      pcVar1 = " uint var;\n";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,lVar5);
LAB_00be8194:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    o_color = vec4(var);\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)outFragSrc,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void generateVarLinkFragmentShaderSrc(std::string& outFragSrc, glu::GLSLVersion glslVersion,
										  const string& precision, TestType testMode)
	{
		std::ostringstream fragSrc;
		fragSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		switch (testMode)
		{
		case SET_DEFAULT_PRECISION:
			fragSrc << "precision " << precision << " int;\n";
		case DEFAULT_PRECISION:
			fragSrc << "flat in uint var;\n";
			break;
		case SET_PRECISION:
			fragSrc << "flat in " << precision << " uint var;\n";
			break;
		}
		fragSrc << "layout(location = 0) out mediump vec4 o_color;\n";
		fragSrc << "void main (void)\n";
		fragSrc << "{\n";
		fragSrc << "    o_color = vec4(var);\n";
		fragSrc << "}\n";
		outFragSrc = fragSrc.str();
	}